

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test::testBody
          (TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *pTVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  TestFilter nameFilter;
  TestFilter local_78;
  undefined1 local_58 [8];
  TestFilter groupFilter;
  char *argv [3];
  int argc;
  TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test *this_local;
  
  groupFilter.next_ = (TestFilter *)anon_var_dwarf_66e4;
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,3,
                     (char **)&groupFilter.next_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0xe6,pTVar3);
  TestFilter::TestFilter((TestFilter *)local_58,"group");
  TestFilter::strictMatching((TestFilter *)local_58);
  pTVar4 = CommandLineArguments::getGroupFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=((TestFilter *)local_58,pTVar4);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xe9);
    }
    bVar1 = TestFilter::operator!=((TestFilter *)local_58,(TestFilter *)local_58);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xe9);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&local_78);
    pcVar6 = SimpleString::asCharString(&local_78.filter_);
    CommandLineArguments::getGroupFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)&nameFilter.next_);
    pcVar7 = SimpleString::asCharString((SimpleString *)&nameFilter.next_);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xe9,pTVar3);
    SimpleString::~SimpleString((SimpleString *)&nameFilter.next_);
    SimpleString::~SimpleString(&local_78.filter_);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xe9,pTVar3);
  }
  TestFilter::TestFilter((TestFilter *)(local_b8 + 0x10),"name");
  TestFilter::strictMatching((TestFilter *)(local_b8 + 0x10));
  pTVar4 = CommandLineArguments::getNameFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=((TestFilter *)(local_b8 + 0x10),pTVar4);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xec);
    }
    bVar1 = TestFilter::operator!=((TestFilter *)(local_b8 + 0x10),(TestFilter *)(local_b8 + 0x10));
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xec);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((TestFilter *)local_b8);
    pcVar6 = SimpleString::asCharString((SimpleString *)local_b8);
    CommandLineArguments::getNameFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_c8);
    pcVar7 = SimpleString::asCharString((SimpleString *)local_c8);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xec,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_c8);
    SimpleString::~SimpleString((SimpleString *)local_b8);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xec,pTVar3);
  }
  TestFilter::~TestFilter((TestFilter *)(local_b8 + 0x10));
  TestFilter::~TestFilter((TestFilter *)local_58);
  return;
}

Assistant:

TEST(CommandLineArguments, setCompleteStrictGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-st", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
    TestFilter nameFilter("name");
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}